

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle-allocator.hh
# Opt level: O2

bool __thiscall
tinyusdz::HandleAllocator<unsigned_long>::Allocate
          (HandleAllocator<unsigned_long> *this,unsigned_long *dst)

{
  pointer puVar1;
  unsigned_long uVar2;
  
  if (dst == (unsigned_long *)0x0) {
    return false;
  }
  puVar1 = (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if ((this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start == puVar1) {
    uVar2 = this->counter_;
    if (uVar2 + 1 < 2) {
      return false;
    }
    this->counter_ = uVar2 + 1;
  }
  else {
    uVar2 = puVar1[-1];
    (this->freeList_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar1 + -1;
    this->dirty_ = true;
  }
  *dst = uVar2;
  return true;
}

Assistant:

bool Allocate(T *dst) {

    if (!dst) {
      return false;
    }

    T handle = 0;

    if (!freeList_.empty()) {
      // Reuse last element.
      handle = freeList_.back();
      freeList_.pop_back();
      // Delay sort until required
      dirty_ = true;
      (*dst) = handle;
      return true;
    }

    handle = counter_;
    if ((handle >= static_cast<T>(1)) && (handle < (std::numeric_limits<T>::max)())) {
      counter_++;
      //std::cout << "conter = " << counter_ << "\n";
      (*dst) = handle;
      return true;
    }

    return false;
  }